

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

void __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EnsureFlat(DescriptorIndex *this)

{
  size_t sVar1;
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
  new_flat;
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
  local_50;
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
  local_38;
  
  if ((this->all_values_).
      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (this->all_values_).
      super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>,_true>
    ::_S_do_it(&this->all_values_);
  }
  sVar1 = (this->by_name_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != 0) {
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ::vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
              *)&local_50,
             ((long)(this->by_name_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->by_name_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 + sVar1,
             (allocator_type *)&local_38);
    std::
    __merge<std::_Rb_tree_const_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>>
              ((this->by_name_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>
                )&(this->by_name_)._M_t._M_impl.super__Rb_tree_header,
               (this->by_name_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->by_name_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (FileEntry *)
               local_50.
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                )(this->by_name_)._M_t._M_impl.
                 super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                 ._M_key_compare.index);
    local_38.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->by_name_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_38.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->by_name_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_38.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->by_name_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->by_name_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_50.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->by_name_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_50.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->by_name_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_50.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_50.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (ExtensionEntry *)0x0;
    local_50.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ::~vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
               *)&local_38);
    std::
    _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ::clear(&(this->by_name_)._M_t);
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
    ::~vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
               *)&local_50);
  }
  sVar1 = (this->by_symbol_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != 0) {
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ::vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
              *)&local_50,
             ((long)(this->by_symbol_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->by_symbol_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 + sVar1,
             (allocator_type *)&local_38);
    std::
    __merge<std::_Rb_tree_const_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry*,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>>
              ((this->by_symbol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>
                )&(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header,
               (this->by_symbol_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->by_symbol_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (SymbolEntry *)
               local_50.
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                )(this->by_symbol_)._M_t._M_impl.
                 super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                 ._M_key_compare.index);
    local_38.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->by_symbol_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_38.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->by_symbol_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_38.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->by_symbol_flat_).
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->by_symbol_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_50.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->by_symbol_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_50.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->by_symbol_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_50.
                  super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_50.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (ExtensionEntry *)0x0;
    local_50.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ::~vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               *)&local_38);
    std::
    _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ::clear(&(this->by_symbol_)._M_t);
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
    ::~vector((vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               *)&local_50);
  }
  sVar1 = (this->by_extension_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != 0) {
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ::vector(&local_50,
             ((long)(this->by_extension_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->by_extension_flat_).
                    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 + sVar1,
             (allocator_type *)&local_38);
    std::
    __merge<std::_Rb_tree_const_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>>
              ((this->by_extension_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>
                )&(this->by_extension_)._M_t._M_impl.super__Rb_tree_header,
               (this->by_extension_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->by_extension_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               local_50.
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (_Iter_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                )(this->by_extension_)._M_t._M_impl.
                 super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                 ._M_key_compare.index);
    local_38.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->by_extension_flat_).
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_38.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->by_extension_flat_).
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_38.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->by_extension_flat_).
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->by_extension_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_50.
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->by_extension_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_50.
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->by_extension_flat_).
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_50.
         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_50.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_50.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50.
    super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ::~vector(&local_38);
    std::
    _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ::clear(&(this->by_extension_)._M_t);
    std::
    vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
    ::~vector(&local_50);
  }
  return;
}

Assistant:

void EncodedDescriptorDatabase::DescriptorIndex::EnsureFlat() {
  all_values_.shrink_to_fit();
  // Merge each of the sets into their flat counterpart.
  MergeIntoFlat(&by_name_, &by_name_flat_);
  MergeIntoFlat(&by_symbol_, &by_symbol_flat_);
  MergeIntoFlat(&by_extension_, &by_extension_flat_);
}